

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O3

void anon_unknown.dwarf_3e8f::test_flip(void **param_1)

{
  _Bool _Var1;
  roaring64_bitmap_t *prVar2;
  roaring64_bitmap_t *prVar3;
  roaring64_bitmap_t *prVar4;
  uint64_t roaring64_bitmap_from_array [4];
  uint64_t auStack_50 [4];
  
  prVar2 = roaring64_bitmap_create();
  prVar3 = roaring64_bitmap_flip(prVar2,10,100000);
  assert_r64_valid((roaring64_bitmap_t *)prVar3);
  _Var1 = roaring64_bitmap_contains_range(prVar3,10,100000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains_range(r2, 10, 100000)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x582);
  roaring64_bitmap_free(prVar2);
  roaring64_bitmap_free(prVar3);
  auStack_50[1] = 3;
  auStack_50[2] = 6;
  auStack_50[0] = 1;
  prVar2 = roaring64_bitmap_of_ptr(3,auStack_50);
  prVar3 = roaring64_bitmap_flip(prVar2,2,5);
  assert_r64_valid((roaring64_bitmap_t *)prVar3);
  auStack_50[0] = 1;
  auStack_50[1] = 2;
  auStack_50[2] = 4;
  auStack_50[3] = 6;
  prVar4 = roaring64_bitmap_of_ptr(4,auStack_50);
  _Var1 = roaring64_bitmap_equals(prVar3,prVar4);
  _assert_true((ulong)_Var1,"roaring64_bitmap_equals(r2, r3)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x58d);
  roaring64_bitmap_free(prVar2);
  roaring64_bitmap_free(prVar3);
  roaring64_bitmap_free(prVar4);
  auStack_50[1] = 3;
  auStack_50[2] = 6;
  auStack_50[0] = 1;
  prVar2 = roaring64_bitmap_of_ptr(3,auStack_50);
  prVar3 = roaring64_bitmap_flip(prVar2,3,3);
  assert_r64_valid((roaring64_bitmap_t *)prVar3);
  _Var1 = roaring64_bitmap_equals(prVar3,prVar2);
  _assert_true((ulong)_Var1,"roaring64_bitmap_equals(r2, r1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x598);
  roaring64_bitmap_free(prVar2);
  roaring64_bitmap_free(prVar3);
  auStack_50[1] = 0x30001;
  auStack_50[2] = 0x40003;
  auStack_50[0] = 0x20000;
  prVar2 = roaring64_bitmap_of_ptr(3,auStack_50);
  prVar3 = roaring64_bitmap_flip(prVar2,0x20000,0x40004);
  prVar4 = roaring64_bitmap_from_range(0x20001,0x40003,1);
  roaring64_bitmap_remove(prVar4,0x30001);
  assert_r64_valid((roaring64_bitmap_t *)prVar3);
  assert_r64_valid((roaring64_bitmap_t *)prVar4);
  _Var1 = roaring64_bitmap_equals(prVar3,prVar4);
  _assert_true((ulong)_Var1,"roaring64_bitmap_equals(r2, r3)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x5a8);
  roaring64_bitmap_free(prVar2);
  roaring64_bitmap_free(prVar3);
  roaring64_bitmap_free(prVar4);
  return;
}

Assistant:

DEFINE_TEST(test_flip) {
    {
        // Flipping an empty bitmap should result in a non-empty range.
        roaring64_bitmap_t* r1 = roaring64_bitmap_create();
        roaring64_bitmap_t* r2 = roaring64_bitmap_flip(r1, 10, 100000);
        assert_r64_valid(r2);
        assert_true(roaring64_bitmap_contains_range(r2, 10, 100000));

        roaring64_bitmap_free(r1);
        roaring64_bitmap_free(r2);
    }
    {
        // Only the specified range should be flipped.
        roaring64_bitmap_t* r1 = roaring64_bitmap_from(1, 3, 6);
        roaring64_bitmap_t* r2 = roaring64_bitmap_flip(r1, 2, 5);
        assert_r64_valid(r2);
        roaring64_bitmap_t* r3 = roaring64_bitmap_from(1, 2, 4, 6);
        assert_true(roaring64_bitmap_equals(r2, r3));

        roaring64_bitmap_free(r1);
        roaring64_bitmap_free(r2);
        roaring64_bitmap_free(r3);
    }
    {
        // An empty range does nothing.
        roaring64_bitmap_t* r1 = roaring64_bitmap_from(1, 3, 6);
        roaring64_bitmap_t* r2 = roaring64_bitmap_flip(r1, 3, 3);
        assert_r64_valid(r2);
        assert_true(roaring64_bitmap_equals(r2, r1));

        roaring64_bitmap_free(r1);
        roaring64_bitmap_free(r2);
    }
    {
        // A bitmap with values in all affected containers.
        roaring64_bitmap_t* r1 =
            roaring64_bitmap_from((2 << 16), (3 << 16) + 1, (4 << 16) + 3);
        roaring64_bitmap_t* r2 =
            roaring64_bitmap_flip(r1, (2 << 16), (4 << 16) + 4);
        roaring64_bitmap_t* r3 =
            roaring64_bitmap_from_range((2 << 16) + 1, (4 << 16) + 3, 1);
        roaring64_bitmap_remove(r3, (3 << 16) + 1);
        assert_r64_valid(r2);
        assert_r64_valid(r3);
        assert_true(roaring64_bitmap_equals(r2, r3));

        roaring64_bitmap_free(r1);
        roaring64_bitmap_free(r2);
        roaring64_bitmap_free(r3);
    }
}